

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

void __thiscall AActor::VelFromAngle(AActor *this,DAngle *angle,double speed)

{
  double dVar1;
  
  dVar1 = TAngle<double>::Cos(angle);
  (this->Vel).X = dVar1 * speed;
  dVar1 = TAngle<double>::Sin(angle);
  (this->Vel).Y = dVar1 * speed;
  return;
}

Assistant:

void VelFromAngle(DAngle angle, double speed)
	{
		Vel.X = speed * angle.Cos();
		Vel.Y = speed * angle.Sin();
	}